

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O1

int evfilt_write_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  byte *pbVar1;
  uint uVar2;
  undefined4 uVar3;
  void *pvVar4;
  uintptr_t uVar5;
  short sVar6;
  unsigned_short uVar7;
  int iVar8;
  uint uVar9;
  undefined8 in_RAX;
  uint *__optval;
  socklen_t slen;
  int serr;
  socklen_t local_28;
  uint local_24;
  
  _local_28 = CONCAT44((uint)((ulong)in_RAX >> 0x20),4);
  epoll_event_dump((epoll_event *)ptr);
  uVar5 = (src->kev).ident;
  uVar3 = *(undefined4 *)((long)&(src->kev).ident + 4);
  sVar6 = (src->kev).filter;
  uVar7 = (src->kev).flags;
  uVar9 = (src->kev).fflags;
  pvVar4 = (src->kev).udata;
  dst->data = (src->kev).data;
  dst->udata = pvVar4;
  *(int *)&dst->ident = (int)uVar5;
  *(undefined4 *)((long)&dst->ident + 4) = uVar3;
  dst->filter = sVar6;
  dst->flags = uVar7;
  dst->fflags = uVar9;
  uVar9 = src->kn_flags;
  if ((uVar9 & 1) == 0) {
    uVar2 = *ptr;
    if ((uVar2 & 0x10) != 0) {
      pbVar1 = (byte *)((long)&dst->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((uVar2 & 8) != 0) {
      if ((uVar9 & 0x3e0) == 0) {
        uVar9 = 5;
      }
      else {
        __optval = &local_24;
        iVar8 = getsockopt((int)(src->kev).ident,1,4,__optval,&local_28);
        if (iVar8 < 0) {
          __optval = (uint *)__errno_location();
        }
        uVar9 = *__optval;
      }
      dst->fflags = uVar9;
      pbVar1 = (byte *)((long)&dst->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if (-1 < (short)dst->flags) {
      iVar8 = ioctl((int)dst->ident,0x5411,&dst->data);
      if (iVar8 < 0) {
        dst->data = 0;
      }
    }
  }
  iVar8 = 0;
  if (((src->kev).flags & 0x80) != 0) {
    iVar8 = knote_disable(filt,src);
  }
  if (((src->kev).flags & 0x10) != 0) {
    iVar8 = knote_delete(filt,src);
  }
  return iVar8 >> 0x1f | 1;
}

Assistant:

int
evfilt_write_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr)
{
    int ret;
    int serr;
    socklen_t slen = sizeof(serr);
    struct epoll_event * const ev = (struct epoll_event *) ptr;

    epoll_event_dump(ev);
    memcpy(dst, &src->kev, sizeof(*dst));

    /*
     * Fast path for files...
     */
    if (src->kn_flags & KNFL_FILE) goto done;

    if (ev->events & EPOLLHUP)
        dst->flags |= EV_EOF;

    if (ev->events & EPOLLERR) {
        if (src->kn_flags & KNFL_SOCKET) {
            ret = getsockopt(src->kev.ident, SOL_SOCKET, SO_ERROR, &serr, &slen);
            dst->fflags = ((ret < 0) ? errno : serr);
        } else
            dst->fflags = EIO;

        /*
         * The only way we seem to be able to signal an error
         * is by setting EOF on the socket.
         */
        dst->flags |= EV_EOF;
    }

    /* On return, data contains the the amount of space remaining in the write buffer */
    if (!(dst->flags & EV_EOF) && (ioctl(dst->ident, SIOCOUTQ, &dst->data) < 0)) {
            /* race condition with socket close, so ignore this error */
            dbg_puts("ioctl(2) of socket failed");
            dst->data = 0;
    }

done:
    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}